

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case0853(ParserTester *this)

{
  string text;
  Expectation X;
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined1 in_stack_fffffffffffffe08 [64];
  undefined8 in_stack_fffffffffffffe48;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe50;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 in_stack_fffffffffffffe80 [64];
  ParseOptions in_stack_fffffffffffffec0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe28,"x y [ ] = { [ 1 ] = 1 } ;",
             (allocator<char> *)&stack0xfffffffffffffe0f);
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe88);
  uVar2 = 0x415040703ee03e8;
  uVar3 = 0x41e041d04180412;
  uVar4 = 0x422041c04220420;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&stack0xfffffffffffffe68;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe10,__l,(allocator_type *)&stack0xfffffffffffffe0e);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe88,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffe10);
  Expectation::Expectation(&local_c0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe48);
  text._M_string_length = in_stack_fffffffffffffe50.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe58.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe60;
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  X.numE_ = in_stack_fffffffffffffe08._0_4_;
  X.numW_ = in_stack_fffffffffffffe08._4_4_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe08._8_24_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe08._32_24_;
  X.continueTestDespiteOfErrors_ = (bool)in_stack_fffffffffffffe08[0x38];
  X.containsAmbiguity_ = (bool)in_stack_fffffffffffffe08[0x39];
  X._58_6_ = in_stack_fffffffffffffe08._58_6_;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe50.BF_all_;
  X.ambiguityText_.field_2._M_allocated_capacity = in_stack_fffffffffffffe58.BF_all_;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe60;
  X._96_8_ = uVar2;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)uVar3;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)uVar4;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe80._0_8_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe80._8_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe80[0x20];
  X._153_7_ = in_stack_fffffffffffffe80._33_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data =
       (_Vector_base<int,_std::allocator<int>_>)
       (_Vector_base<int,_std::allocator<int>_>)in_stack_fffffffffffffe80._40_24_;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe28,in_stack_fffffffffffffec0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            ((_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe10);
  Expectation::~Expectation((Expectation *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  return;
}

Assistant:

void ParserTester::case0853()
{
    parse("x y [ ] = { [ 1 ] = 1 } ;",
          Expectation().AST( { SyntaxKind::TranslationUnit,
                               SyntaxKind::VariableAndOrFunctionDeclaration,
                               SyntaxKind::TypedefName,
                               SyntaxKind::ArrayDeclarator,
                               SyntaxKind::IdentifierDeclarator,
                               SyntaxKind::SubscriptSuffix,
                               SyntaxKind::BraceEnclosedInitializer,
                               SyntaxKind::DesignatedInitializer,
                               SyntaxKind::ArrayDesignator,
                               SyntaxKind::IntegerConstantExpression,
                               SyntaxKind::ExpressionInitializer,
                               SyntaxKind::IntegerConstantExpression }));
}